

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

void __thiscall YAJLTables::fetch_etable(YAJLTables *this,u16 marker,bitio_stream *bstream)

{
  YAJLEntropyTable *pYVar1;
  uint __line;
  int i;
  ssize_t sVar2;
  YAJLArithmeticTable *this_00;
  ulong uVar3;
  YAJLHuffmanTable *this_01;
  long lVar4;
  size_t in_RCX;
  ulong uVar5;
  int iVar6;
  undefined6 in_register_00000032;
  char *__assertion;
  int iVar7;
  YAJLEntropyTable local_48;
  
  sVar2 = bitio::bitio_stream::read(bstream,0x10,bstream,in_RCX);
  iVar7 = (int)sVar2 + -2;
  iVar6 = (int)CONCAT62(in_register_00000032,marker);
  if (iVar6 == 0xffc4) {
    while ((short)iVar7 != 0) {
      local_48.marker = 0;
      local_48.huffman_table = (YAJLHuffmanTable *)0x0;
      local_48.arithmetic_table = (YAJLArithmeticTable *)0x0;
      YAJLEntropyTable::set_marker(&local_48,0xffc4);
      this_01 = (YAJLHuffmanTable *)operator_new(0x28);
      YAJLHuffmanTable::YAJLHuffmanTable(this_01,bstream);
      iVar7 = iVar7 + -0x11;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        iVar7 = iVar7 - (uint)this_01->ncodes[lVar4];
      }
      uVar3 = (ulong)this_01->table_dest;
      local_48.huffman_table = this_01;
      if (3 < uVar3) {
        __assertion = "etable.huffman_table->table_dest < 4";
        __line = 0x5e;
        goto LAB_001046d6;
      }
      uVar5 = (ulong)this_01->table_class;
      if (1 < uVar5) {
        __assertion = "etable.huffman_table->table_class < 2";
        __line = 0x5f;
        goto LAB_001046d6;
      }
      this->etables[uVar3][uVar5].arithmetic_table = local_48.arithmetic_table;
      pYVar1 = this->etables[uVar3] + uVar5;
      *(ulong *)pYVar1 = CONCAT62(local_48._2_6_,local_48.marker);
      pYVar1->huffman_table = this_01;
    }
  }
  else {
    if (iVar6 != 0xffcc) {
      fprintf(_stderr,"Unhandled marker at: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
             );
      exit(1);
    }
    for (; (short)iVar7 != 0; iVar7 = iVar7 + -2) {
      local_48.marker = 0;
      local_48.huffman_table = (YAJLHuffmanTable *)0x0;
      local_48.arithmetic_table = (YAJLArithmeticTable *)0x0;
      YAJLEntropyTable::set_marker(&local_48,0xffcc);
      this_00 = (YAJLArithmeticTable *)operator_new(3);
      YAJLArithmeticTable::YAJLArithmeticTable(this_00,bstream);
      uVar3 = (ulong)this_00->table_dest;
      local_48.arithmetic_table = this_00;
      if (3 < uVar3) {
        __assertion = "etable.arithmetic_table->table_dest < 4";
        __line = 0x69;
LAB_001046d6:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,__line,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      uVar5 = (ulong)this_00->table_class;
      if (1 < uVar5) {
        __assertion = "etable.arithmetic_table->table_class < 2";
        __line = 0x6a;
        goto LAB_001046d6;
      }
      this->etables[uVar3][uVar5].arithmetic_table = this_00;
      pYVar1 = this->etables[uVar3] + uVar5;
      *(ulong *)pYVar1 = CONCAT62(local_48._2_6_,local_48.marker);
      pYVar1->huffman_table = local_48.huffman_table;
    }
  }
  return;
}

Assistant:

void YAJLTables::fetch_etable(u16 marker, bitio::bitio_stream *bstream) {
    u16 length = bstream->read(0x10);
    length -= 2;
    if (marker == markers::DHT) {
        while (length > 0) {
            YAJLEntropyTable etable{};
            etable.set_marker(marker);
            etable.huffman_table = new YAJLHuffmanTable(bstream);

            length -= 17;
            for (int i = 0; i < 16; i++) {
                length -= etable.huffman_table->ncodes[i];
            }

            assert(etable.huffman_table->table_dest < 4);
            assert(etable.huffman_table->table_class < 2);

            etables[etable.huffman_table->table_dest][etable.huffman_table->table_class] = etable;
        }
    } else if (marker == markers::DAC) {
        while (length > 0) {
            YAJLEntropyTable etable{};
            etable.set_marker(marker);
            etable.arithmetic_table = new YAJLArithmeticTable(bstream);

            assert(etable.arithmetic_table->table_dest < 4);
            assert(etable.arithmetic_table->table_class < 2);
            etables[etable.arithmetic_table->table_dest][etable.arithmetic_table->table_class] = etable;
            length -= 2;
        }
    } else {
        fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
        exit(1);
    }
}